

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O2

void test_bson_iter_overflow(void)

{
  char cVar1;
  bson_t *pbVar2;
  undefined8 uVar3;
  char *pcVar4;
  bson_iter_t iter;
  undefined1 auStack_100 [240];
  
  pbVar2 = get_bson(
                   "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/overflow1.bson"
                   );
  if (pbVar2 == (bson_t *)0x0) {
    pbVar2 = get_bson(
                     "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/overflow2.bson"
                     );
    if (pbVar2 == (bson_t *)0x0) {
      pcVar4 = "b";
      uVar3 = 0x94;
    }
    else {
      cVar1 = bson_iter_init(auStack_100,pbVar2);
      if (cVar1 == '\0') {
        pcVar4 = "bson_iter_init (&iter, b)";
        uVar3 = 0x95;
      }
      else {
        cVar1 = bson_iter_next(auStack_100);
        if (cVar1 == '\0') {
          bson_destroy(pbVar2);
          return;
        }
        pcVar4 = "!bson_iter_next (&iter)";
        uVar3 = 0x96;
      }
    }
  }
  else {
    pcVar4 = "!b";
    uVar3 = 0x91;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
          uVar3,"test_bson_iter_overflow",pcVar4);
  abort();
}

Assistant:

static void
test_bson_iter_overflow (void)
{
   bson_iter_t iter;
   bson_t *b;

   b = get_bson (BINARY_DIR "/overflow1.bson");
   BSON_ASSERT (!b);

   b = get_bson (BINARY_DIR "/overflow2.bson");
   BSON_ASSERT (b);
   BSON_ASSERT (bson_iter_init (&iter, b));
   BSON_ASSERT (!bson_iter_next (&iter));
   bson_destroy (b);
}